

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

CHAR LocalRegionGrayValuePredictZ7(IplImage *pImage)

{
  uint uVar1;
  UINT local_438;
  int best_threshold;
  UINT count_of_gray [256];
  uint local_2c;
  uint local_28;
  INT32U sum_value;
  INT32U sum_value1;
  INT32U locate_value;
  INT32U col;
  INT32U row;
  IplImage *pImage_local;
  
  local_28 = 0;
  local_2c = 0;
  memset(&local_438,0,0x400);
  for (locate_value = 7; locate_value < 0xe; locate_value = locate_value + 1) {
    for (sum_value1 = 1; sum_value1 < 0xe; sum_value1 = sum_value1 + 1) {
      (&local_438)[pImage->imageData[locate_value * pImage->widthStep + sum_value1]] =
           (&local_438)[pImage->imageData[locate_value * pImage->widthStep + sum_value1]] + 1;
    }
  }
  uVar1 = get_best_threshold(&local_438);
  for (locate_value = 10; locate_value < 0xe; locate_value = locate_value + 1) {
    for (sum_value1 = 1; sum_value1 < 5; sum_value1 = sum_value1 + 1) {
      sum_value = (INT32U)(pImage->imageData[locate_value * pImage->widthStep + sum_value1] <= uVar1
                          );
      local_2c = sum_value + local_2c;
    }
  }
  for (locate_value = 10; locate_value < 0xe; locate_value = locate_value + 1) {
    for (sum_value1 = 10; sum_value1 < 0xe; sum_value1 = sum_value1 + 1) {
      sum_value = (INT32U)(pImage->imageData[locate_value * pImage->widthStep + sum_value1] <= uVar1
                          );
      local_28 = sum_value + local_28;
    }
  }
  if (local_28 < local_2c) {
    local_2c = local_28;
  }
  if (local_2c < 3) {
    pImage_local._7_1_ = '7';
  }
  else {
    pImage_local._7_1_ = 'Z';
  }
  return pImage_local._7_1_;
}

Assistant:

CHAR LocalRegionGrayValuePredictZ7(IplImage *pImage) {
    INT32U row, col, locate_value, sum_value1 = 0, sum_value = 0;

    //    区域 [7:14,1:14]
    UINT count_of_gray[256] = {0};
    int best_threshold;

    for (row = 7; row < 14; row++) {
        for (col = 1; col < 14; col++) {
            // get the pixel,
            locate_value = pImage->imageData[row * pImage->widthStep + col];
            count_of_gray[locate_value] += 1;

        }
    }
    //    寻找 最优 二值化 阈值
    best_threshold = get_best_threshold(count_of_gray);

    //    区域 [10:14,1:5] 和
    for (row = 10; row < 14; row++) {
        for (col = 1; col < 5; col++) {
            // get the pixel
            locate_value = pImage->imageData[row * pImage->widthStep + col];
//            二值化,背景是黑色（0），前景是白色（1）
            if (locate_value <= best_threshold)
                locate_value = 1;
            else
                locate_value = 0;

            sum_value += locate_value;
        }

    }
//    区域 [10:14,10:14]
    for (row = 10; row < 14; row++) {
        for (col = 10; col < 14; col++) {
            // get the pixel
            locate_value = pImage->imageData[row * pImage->widthStep + col];
            //            二值化,背景是黑色（0），前景是白色（1）
            if (locate_value <= best_threshold)
                locate_value = 1;
            else
                locate_value = 0;

            sum_value1 += locate_value;
        }
    }

    if (sum_value1 < sum_value)
        sum_value = sum_value1;

    if (sum_value > 2)
        return 'Z';
    else
        return '7';
}